

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

int NULLCTypeInfo::IsFunction(int id)

{
  ExternTypeInfo *pEVar1;
  int id_local;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),id);
    return (int)(pEVar1->subCat == CAT_FUNCTION);
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0x7f,"int NULLCTypeInfo::IsFunction(int)");
}

Assistant:

int IsFunction(int id)
	{
		assert(linker);
		return linker->exTypes[id].subCat == ExternTypeInfo::CAT_FUNCTION;
	}